

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O0

void Debug::posixSignalHandler(int signum,siginfo_t *si,void *ucontext)

{
  bool bVar1;
  PosixCrashHandler *this;
  function<void_()> *this_00;
  PosixCrashHandler *handler;
  void *ucontext_local;
  siginfo_t *si_local;
  int signum_local;
  
  this = PosixCrashHandler::getInstance();
  PosixCrashHandler::handleCrash(this);
  this_00 = (function<void_()> *)0x3;
  _Exit(3);
  bVar1 = std::function::operator_cast_to_bool((function *)this_00);
  if (bVar1) {
    std::function<void_()>::operator()(this_00);
  }
  return;
}

Assistant:

void posixSignalHandler( int signum, siginfo_t* si, void* ucontext ) {
        (void)si;
        (void)ucontext;

        auto &handler = PosixCrashHandler::getInstance();
        handler.handleCrash();

        // If you caught one of the above signals, it is likely you just
        // want to quit your program right now.
        //exit( signum );
        std::_Exit(CHILLOUT_EXIT_CODE);
    }